

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall
leveldb::_Test_L0_CompactionBug_Issue44_a::_Run(_Test_L0_CompactionBug_Issue44_a *this)

{
  allocator local_1f2;
  allocator local_1f1;
  undefined1 local_1f0 [8];
  string local_1e8;
  undefined1 local_1c8 [448];
  
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_1c8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5ae);
  std::__cxx11::string::string((string *)(local_1f0 + 8),"b",&local_1f1);
  std::__cxx11::string::string((string *)local_1c8,"v",&local_1f2);
  DBTest::Put((DBTest *)local_1f0,(string *)this,(string *)(local_1f0 + 8));
  test::Tester::IsOk((Tester *)(local_1c8 + 0x20),(Status *)local_1f0);
  Status::~Status((Status *)local_1f0);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  test::Tester::~Tester((Tester *)(local_1c8 + 0x20));
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_1c8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5b0);
  std::__cxx11::string::string((string *)(local_1f0 + 8),"b",(allocator *)local_1f0);
  DBTest::Delete((DBTest *)local_1c8,(string *)this);
  test::Tester::IsOk((Tester *)(local_1c8 + 0x20),(Status *)local_1c8);
  Status::~Status((Status *)local_1c8);
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  test::Tester::~Tester((Tester *)(local_1c8 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_1c8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5b1);
  std::__cxx11::string::string((string *)(local_1f0 + 8),"a",(allocator *)local_1f0);
  DBTest::Delete((DBTest *)local_1c8,(string *)this);
  test::Tester::IsOk((Tester *)(local_1c8 + 0x20),(Status *)local_1c8);
  Status::~Status((Status *)local_1c8);
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  test::Tester::~Tester((Tester *)(local_1c8 + 0x20));
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_1c8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5b3);
  std::__cxx11::string::string((string *)(local_1f0 + 8),"a",(allocator *)local_1f0);
  DBTest::Delete((DBTest *)local_1c8,(string *)this);
  test::Tester::IsOk((Tester *)(local_1c8 + 0x20),(Status *)local_1c8);
  Status::~Status((Status *)local_1c8);
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  test::Tester::~Tester((Tester *)(local_1c8 + 0x20));
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_1c8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5b5);
  std::__cxx11::string::string((string *)(local_1f0 + 8),"a",&local_1f1);
  std::__cxx11::string::string((string *)local_1c8,"v",&local_1f2);
  DBTest::Put((DBTest *)local_1f0,(string *)this,(string *)(local_1f0 + 8));
  test::Tester::IsOk((Tester *)(local_1c8 + 0x20),(Status *)local_1f0);
  Status::~Status((Status *)local_1f0);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  test::Tester::~Tester((Tester *)(local_1c8 + 0x20));
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_1c8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5b8);
  DBTest::Contents_abi_cxx11_((string *)(local_1f0 + 8),&this->super_DBTest);
  test::Tester::IsEq<char[7],std::__cxx11::string>
            ((Tester *)(local_1c8 + 0x20),(char (*) [7])"(a->v)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  test::Tester::~Tester((Tester *)(local_1c8 + 0x20));
  anon_unknown_4::DelayMilliseconds(1000);
  test::Tester::Tester
            ((Tester *)(local_1c8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5ba);
  DBTest::Contents_abi_cxx11_((string *)(local_1f0 + 8),&this->super_DBTest);
  test::Tester::IsEq<char[7],std::__cxx11::string>
            ((Tester *)(local_1c8 + 0x20),(char (*) [7])"(a->v)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  test::Tester::~Tester((Tester *)(local_1c8 + 0x20));
  return;
}

Assistant:

TEST(DBTest, L0_CompactionBug_Issue44_a) {
  Reopen();
  ASSERT_OK(Put("b", "v"));
  Reopen();
  ASSERT_OK(Delete("b"));
  ASSERT_OK(Delete("a"));
  Reopen();
  ASSERT_OK(Delete("a"));
  Reopen();
  ASSERT_OK(Put("a", "v"));
  Reopen();
  Reopen();
  ASSERT_EQ("(a->v)", Contents());
  DelayMilliseconds(1000);  // Wait for compaction to finish
  ASSERT_EQ("(a->v)", Contents());
}